

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * exprDup(sqlite3 *db,Expr *p,int dupFlags,EdupBuf *pEdupBuf)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  Select *pSVar5;
  ExprList *pEVar6;
  Window *pWVar7;
  Expr *pEVar8;
  long *in_RCX;
  int in_EDX;
  sqlite3 *in_RSI;
  long in_FS_OFFSET;
  char *zToken;
  u32 nSize;
  int nNewSize;
  uint nStructSize;
  int nAlloc;
  int nToken;
  u32 staticFlag;
  Expr *pNew;
  EdupBuf sEdupBuf;
  char *in_stack_ffffffffffffff78;
  Window *in_stack_ffffffffffffff80;
  sqlite3 *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined8 in_stack_ffffffffffffffa0;
  int flags;
  Select *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffbc;
  int iVar9;
  uint uVar10;
  sqlite3 *db_00;
  undefined4 in_stack_ffffffffffffffd8;
  sqlite3 *local_10;
  
  flags = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar9 = -1;
  if (in_RCX == (long *)0x0) {
    if (in_EDX == 0) {
      if ((((ulong)in_RSI->pVfs & 0x80000000000) == 0) &&
         (((anon_union_8_2_443a03b8_for_u *)&in_RSI->pVdbe)->zToken != (char *)0x0)) {
        sVar4 = strlen(((anon_union_8_2_443a03b8_for_u *)&in_RSI->pVdbe)->zToken);
        uVar10 = (uint)sVar4 & 0x3fffffff;
        iVar9 = uVar10 + 1;
        in_stack_ffffffffffffffbc = uVar10 + 0x50 & 0xfffffff8;
      }
      else {
        iVar9 = 0;
        in_stack_ffffffffffffffbc = 0x48;
      }
    }
    else {
      in_stack_ffffffffffffffbc = dupedExprSize((Expr *)in_stack_ffffffffffffff80);
    }
    local_10 = (sqlite3 *)
               sqlite3DbMallocRawNN(in_stack_ffffffffffffff88,(u64)in_stack_ffffffffffffff80);
    uVar10 = 0;
  }
  else {
    local_10 = (sqlite3 *)*in_RCX;
    uVar10 = 0x8000000;
  }
  db_00 = local_10;
  if (local_10 != (sqlite3 *)0x0) {
    uVar2 = dupedExprStructSize((Expr *)in_RSI,in_EDX);
    uVar3 = uVar2 & 0xfff;
    if (iVar9 < 0) {
      if ((((ulong)in_RSI->pVfs & 0x80000000000) == 0) &&
         (((anon_union_8_2_443a03b8_for_u *)&in_RSI->pVdbe)->zToken != (char *)0x0)) {
        iVar9 = sqlite3Strlen30(in_stack_ffffffffffffff78);
        iVar9 = iVar9 + 1;
      }
      else {
        iVar9 = 0;
      }
    }
    if (in_EDX == 0) {
      in_stack_ffffffffffffffb0 = exprStructSize((Expr *)in_RSI);
      memcpy(local_10,in_RSI,(ulong)in_stack_ffffffffffffffb0);
      if (in_stack_ffffffffffffffb0 < 0x48) {
        memset((u8 *)((long)&local_10->pVfs + (ulong)in_stack_ffffffffffffffb0),0,
               0x48 - (ulong)in_stack_ffffffffffffffb0);
      }
      uVar3 = 0x48;
    }
    else {
      memcpy(local_10,in_RSI,(long)(int)uVar3);
    }
    *(u32 *)((long)&db_00->pVfs + 4) = *(u32 *)((long)&db_00->pVfs + 4) & 0xf7febfff;
    *(uint *)((long)&db_00->pVfs + 4) = uVar2 & 0x14000 | *(u32 *)((long)&db_00->pVfs + 4);
    *(uint *)((long)&db_00->pVfs + 4) = uVar10 | *(u32 *)((long)&db_00->pVfs + 4);
    if (0 < iVar9) {
      in_stack_ffffffffffffffa8 = (Select *)((long)&local_10->pVfs + (long)(int)uVar3);
      ((anon_union_8_2_443a03b8_for_u *)&db_00->pVdbe)->zToken = (char *)in_stack_ffffffffffffffa8;
      memcpy(in_stack_ffffffffffffffa8,((anon_union_8_2_443a03b8_for_u *)&in_RSI->pVdbe)->zToken,
             (long)iVar9);
      uVar3 = iVar9 + uVar3;
    }
    local_10 = (sqlite3 *)((long)&local_10->pVfs + (long)(int)(uVar3 + 7 & 0xfffffff8));
    if (((*(u32 *)((long)&in_RSI->pVfs + 4) | *(uint *)((long)&db_00->pVfs + 4)) & 0x810000) == 0) {
      if (((ulong)in_RSI->pVfs & 0x100000000000) == 0) {
        in_stack_ffffffffffffff94 = in_EDX;
        if (*(u8 *)&in_RSI->pVfs == 0x92) {
          in_stack_ffffffffffffff94 = 0;
        }
        pEVar6 = sqlite3ExprListDup(db_00,(ExprList *)CONCAT44(uVar10,iVar9),
                                    in_stack_ffffffffffffffbc);
        ((anon_union_8_2_a01b6dbf_for_x *)&db_00->aDb)->pList = pEVar6;
      }
      else {
        pSVar5 = sqlite3SelectDup((sqlite3 *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),
                                  in_stack_ffffffffffffffa8,flags);
        ((anon_union_8_2_a01b6dbf_for_x *)&db_00->aDb)->pSelect = pSVar5;
      }
      if (((ulong)in_RSI->pVfs & 0x100000000000000) != 0) {
        pWVar7 = sqlite3WindowDup((sqlite3 *)
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                  (Expr *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
        ((anon_union_8_3_c79b3df9_for_y *)&db_00->szMmap)->pWin = pWVar7;
      }
      iVar9 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
      if (in_EDX == 0) {
        if (*(char *)&in_RSI->pVfs == -0x4e) {
          db_00->pDfltColl = (CollSeq *)in_RSI->pDfltColl;
        }
        else {
          pEVar8 = sqlite3ExprDup((sqlite3 *)
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                  (Expr *)in_stack_ffffffffffffff88,iVar9);
          db_00->pDfltColl = (CollSeq *)pEVar8;
        }
        pEVar8 = sqlite3ExprDup((sqlite3 *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                (Expr *)in_stack_ffffffffffffff88,iVar9);
        db_00->mutex = (sqlite3_mutex *)pEVar8;
      }
      else {
        if (*(char *)&in_RSI->pVfs == -0x4e) {
          db_00->pDfltColl = (CollSeq *)in_RSI->pDfltColl;
        }
        else {
          if (in_RSI->pDfltColl == (CollSeq *)0x0) {
            pEVar8 = (Expr *)0x0;
          }
          else {
            pEVar8 = exprDup(in_RSI,(Expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),
                             (int)((ulong)in_RCX >> 0x20),(EdupBuf *)db_00);
          }
          db_00->pDfltColl = (CollSeq *)pEVar8;
        }
        if (in_RSI->mutex == (sqlite3_mutex *)0x0) {
          pEVar8 = (Expr *)0x0;
        }
        else {
          pEVar8 = exprDup(in_RSI,(Expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),
                           (int)((ulong)in_RCX >> 0x20),(EdupBuf *)db_00);
        }
        db_00->mutex = (sqlite3_mutex *)pEVar8;
      }
    }
  }
  if (in_RCX != (long *)0x0) {
    *in_RCX = (long)local_10;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Expr *)db_00;
  }
  __stack_chk_fail();
}

Assistant:

static Expr *exprDup(
  sqlite3 *db,          /* Database connection (for memory allocation) */
  const Expr *p,        /* Expr tree to be duplicated */
  int dupFlags,         /* EXPRDUP_REDUCE for compression.  0 if not */
  EdupBuf *pEdupBuf     /* Preallocated storage space, or NULL */
){
  Expr *pNew;           /* Value to return */
  EdupBuf sEdupBuf;     /* Memory space from which to build Expr object */
  u32 staticFlag;       /* EP_Static if space not obtained from malloc */
  int nToken = -1;       /* Space needed for p->u.zToken.  -1 means unknown */

  assert( db!=0 );
  assert( p );
  assert( dupFlags==0 || dupFlags==EXPRDUP_REDUCE );
  assert( pEdupBuf==0 || dupFlags==EXPRDUP_REDUCE );

  /* Figure out where to write the new Expr structure. */
  if( pEdupBuf ){
    sEdupBuf.zAlloc = pEdupBuf->zAlloc;
#ifdef SQLITE_DEBUG
    sEdupBuf.zEnd = pEdupBuf->zEnd;
#endif
    staticFlag = EP_Static;
    assert( sEdupBuf.zAlloc!=0 );
    assert( dupFlags==EXPRDUP_REDUCE );
  }else{
    int nAlloc;
    if( dupFlags ){
      nAlloc = dupedExprSize(p);
    }else if( !ExprHasProperty(p, EP_IntValue) && p->u.zToken ){
      nToken = sqlite3Strlen30NN(p->u.zToken)+1;
      nAlloc = ROUND8(EXPR_FULLSIZE + nToken);
    }else{
      nToken = 0;
      nAlloc = ROUND8(EXPR_FULLSIZE);
    }
    assert( nAlloc==ROUND8(nAlloc) );
    sEdupBuf.zAlloc = sqlite3DbMallocRawNN(db, nAlloc);
#ifdef SQLITE_DEBUG
    sEdupBuf.zEnd = sEdupBuf.zAlloc ? sEdupBuf.zAlloc+nAlloc : 0;
#endif

    staticFlag = 0;
  }
  pNew = (Expr *)sEdupBuf.zAlloc;
  assert( EIGHT_BYTE_ALIGNMENT(pNew) );

  if( pNew ){
    /* Set nNewSize to the size allocated for the structure pointed to
    ** by pNew. This is either EXPR_FULLSIZE, EXPR_REDUCEDSIZE or
    ** EXPR_TOKENONLYSIZE. nToken is set to the number of bytes consumed
    ** by the copy of the p->u.zToken string (if any).
    */
    const unsigned nStructSize = dupedExprStructSize(p, dupFlags);
    int nNewSize = nStructSize & 0xfff;
    if( nToken<0 ){
      if( !ExprHasProperty(p, EP_IntValue) && p->u.zToken ){
        nToken = sqlite3Strlen30(p->u.zToken) + 1;
      }else{
        nToken = 0;
      }
    }
    if( dupFlags ){
      assert( (int)(sEdupBuf.zEnd - sEdupBuf.zAlloc) >= nNewSize+nToken );
      assert( ExprHasProperty(p, EP_Reduced)==0 );
      memcpy(sEdupBuf.zAlloc, p, nNewSize);
    }else{
      u32 nSize = (u32)exprStructSize(p);
      assert( (int)(sEdupBuf.zEnd - sEdupBuf.zAlloc) >=
                                                   (int)EXPR_FULLSIZE+nToken );
      memcpy(sEdupBuf.zAlloc, p, nSize);
      if( nSize<EXPR_FULLSIZE ){
        memset(&sEdupBuf.zAlloc[nSize], 0, EXPR_FULLSIZE-nSize);
      }
      nNewSize = EXPR_FULLSIZE;
    }

    /* Set the EP_Reduced, EP_TokenOnly, and EP_Static flags appropriately. */
    pNew->flags &= ~(EP_Reduced|EP_TokenOnly|EP_Static);
    pNew->flags |= nStructSize & (EP_Reduced|EP_TokenOnly);
    pNew->flags |= staticFlag;
    ExprClearVVAProperties(pNew);
    if( dupFlags ){
      ExprSetVVAProperty(pNew, EP_Immutable);
    }

    /* Copy the p->u.zToken string, if any. */
    assert( nToken>=0 );
    if( nToken>0 ){
      char *zToken = pNew->u.zToken = (char*)&sEdupBuf.zAlloc[nNewSize];
      memcpy(zToken, p->u.zToken, nToken);
      nNewSize += nToken;
    }
    sEdupBuf.zAlloc += ROUND8(nNewSize);

    if( ((p->flags|pNew->flags)&(EP_TokenOnly|EP_Leaf))==0 ){

      /* Fill in the pNew->x.pSelect or pNew->x.pList member. */
      if( ExprUseXSelect(p) ){
        pNew->x.pSelect = sqlite3SelectDup(db, p->x.pSelect, dupFlags);
      }else{
        pNew->x.pList = sqlite3ExprListDup(db, p->x.pList,
                           p->op!=TK_ORDER ? dupFlags : 0);
      }

#ifndef SQLITE_OMIT_WINDOWFUNC
      if( ExprHasProperty(p, EP_WinFunc) ){
        pNew->y.pWin = sqlite3WindowDup(db, pNew, p->y.pWin);
        assert( ExprHasProperty(pNew, EP_WinFunc) );
      }
#endif /* SQLITE_OMIT_WINDOWFUNC */

      /* Fill in pNew->pLeft and pNew->pRight. */
      if( dupFlags ){
        if( p->op==TK_SELECT_COLUMN ){
          pNew->pLeft = p->pLeft;
          assert( p->pRight==0
               || p->pRight==p->pLeft
               || ExprHasProperty(p->pLeft, EP_Subquery) );
        }else{
          pNew->pLeft = p->pLeft ?
                      exprDup(db, p->pLeft, EXPRDUP_REDUCE, &sEdupBuf) : 0;
        }
        pNew->pRight = p->pRight ?
                       exprDup(db, p->pRight, EXPRDUP_REDUCE, &sEdupBuf) : 0;
      }else{
        if( p->op==TK_SELECT_COLUMN ){
          pNew->pLeft = p->pLeft;
          assert( p->pRight==0
               || p->pRight==p->pLeft
               || ExprHasProperty(p->pLeft, EP_Subquery) );
        }else{
          pNew->pLeft = sqlite3ExprDup(db, p->pLeft, 0);
        }
        pNew->pRight = sqlite3ExprDup(db, p->pRight, 0);
      }
    }
  }
  if( pEdupBuf ) memcpy(pEdupBuf, &sEdupBuf, sizeof(sEdupBuf));
  assert( sEdupBuf.zAlloc <= sEdupBuf.zEnd );
  return pNew;
}